

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# impl_canbus.cc
# Opt level: O0

bool __thiscall ccel::canbus::canbus_handler::loopback(canbus_handler *this,bool turn)

{
  native_handle_type __fd;
  int iVar1;
  runtime_error *this_00;
  byte in_SIL;
  long in_RDI;
  descriptor *in_stack_ffffffffffffffd0;
  byte local_9 [9];
  
  local_9[0] = in_SIL & 1;
  __fd = boost::asio::posix::descriptor::native_handle(in_stack_ffffffffffffffd0);
  iVar1 = setsockopt(__fd,0x65,3,local_9,1);
  if (iVar1 < 0) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"[CANBus Handler]Enabling loopback failed.");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  *(byte *)(in_RDI + 0x29) = local_9[0] & 1;
  return (bool)(*(byte *)(in_RDI + 0x29) & 1);
}

Assistant:

const bool canbus_handler::loopback(const bool turn) {
  if(setsockopt(_stream.native_handle(), SOL_CAN_RAW, CAN_RAW_LOOPBACK, &turn,
                sizeof(turn)) < 0)
    throw std::runtime_error("[CANBus Handler]Enabling loopback failed.");
  _loopback = turn;
  return _loopback;
}